

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_50b73::SetSourceiv
          (anon_unknown_dwarf_50b73 *this,ALsource *Source,ALCcontext *Context,SourceProp prop,
          span<const_int,_18446744073709551615UL> values)

{
  int *piVar1;
  mutex *__mutex;
  uint uVar2;
  ALCdevice *device;
  BufferlistItem *pBVar3;
  int OffsetType;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  Voice *pVVar8;
  ALbuffer *pAVar9;
  ALfilter *pAVar10;
  undefined8 *puVar11;
  undefined4 in_register_0000000c;
  uint *puVar12;
  ulong uVar13;
  __pointer_type pBVar14;
  long lVar15;
  ALenum AVar16;
  ALuint id;
  size_t size;
  pointer piVar17;
  float *pfVar18;
  _Head_base<0UL,_BufferlistItem_*,_false> _Var19;
  ALCcontext *Context_00;
  long lVar20;
  char *pcVar21;
  span<const_float,_18446744073709551615UL> values_00;
  unique_lock<std::mutex> slotlock;
  unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> temp;
  VoicePos local_78;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  float local_50 [2];
  optional<(anonymous_namespace)::VoicePos> local_48;
  
  puVar12 = (uint *)CONCAT44(in_register_0000000c,prop);
  piVar17 = values.mData;
  Context_00 = (ALCcontext *)((ulong)Context & 0xffffffff);
  device = *(ALCdevice **)&Source[1].mDistanceModel;
  slotlock._M_device = (mutex_type *)0x0;
  slotlock._M_owns = false;
  OffsetType = (int)Context;
  uVar7 = 1;
  switch(OffsetType) {
  case 0x1001:
  case 0x1002:
  case 0x1003:
  case 0x100a:
  case 0x100d:
  case 0x100e:
  case 0x1020:
  case 0x1021:
  case 0x1022:
  case 0x1023:
  case 0x1031:
switchD_00121790_caseD_1001:
    lVar20 = (long)piVar17 - (long)puVar12 >> 2;
    if ((lVar20 == 1) || (lVar20 == 6)) {
      pfVar18 = (float *)((long)&local_68 + 4);
      uVar7 = *puVar12;
LAB_001218a4:
      pfVar18[-1] = (float)(int)uVar7;
LAB_001218aa:
      values_00.mDataEnd = &Source->Pitch;
      values_00.mData = pfVar18;
      bVar5 = SetSourcefv(this,Source,Context_00,(SourceProp)&local_68,values_00);
      goto LAB_00121f77;
    }
    break;
  case 0x1004:
  case 0x1005:
  case 0x1006:
    lVar20 = (long)piVar17 - (long)puVar12 >> 2;
    if ((lVar20 == 3) || (lVar20 == 6)) {
      pfVar18 = &fStack_5c;
      local_68 = CONCAT44((float)(int)((ulong)*(undefined8 *)puVar12 >> 0x20),
                          (float)(int)*(undefined8 *)puVar12);
      uVar7 = puVar12[2];
      goto LAB_001218a4;
    }
LAB_00122278:
    uVar7 = 3;
    break;
  case 0x1007:
    lVar20 = (long)piVar17 - (long)puVar12 >> 2;
    if ((lVar20 == 1) || (lVar20 == 6)) {
      if (*puVar12 < 2) {
        this[0x65] = SUB41(*puVar12,0);
        bVar5 = true;
        if (((*(uint *)(this + 0x178) & 0xfffffffe) == 0x1012) &&
           (pVVar8 = GetSourceVoice((ALsource *)this,(ALCcontext *)Source), pVVar8 != (Voice *)0x0))
        {
          if (this[0x65] == (anon_unknown_dwarf_50b73)0x1) {
            pBVar14 = *(__pointer_type *)(this + 0x180);
          }
          else {
            pBVar14 = (__pointer_type)0x0;
          }
          (pVVar8->mLoopBuffer)._M_b._M_p = pBVar14;
          ALCdevice::waitForMix(device);
        }
        goto LAB_00121f77;
      }
LAB_00121fed:
      bVar5 = false;
      ALCcontext::setError((ALCcontext *)Source,0xa003,"Value out of range");
      goto LAB_00121f77;
    }
    Context_00 = (ALCcontext *)0x1007;
    break;
  case 0x1008:
  case 0x100b:
  case 0x100c:
  case 0x1011:
  case 0x1012:
  case 0x1013:
  case 0x1014:
  case 0x1017:
  case 0x1018:
  case 0x1019:
  case 0x101a:
  case 0x101b:
  case 0x101c:
  case 0x101d:
  case 0x101e:
  case 0x101f:
  case 0x1028:
  case 0x1029:
  case 0x102a:
  case 0x102b:
  case 0x102c:
  case 0x102d:
  case 0x102e:
  case 0x102f:
  case 0x1030:
  case 0x1032:
switchD_00121790_caseD_1008:
    pcVar21 = "Invalid source integer property 0x%04x";
    AVar16 = 0xa002;
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",Context_00);
    }
    goto LAB_00121f63;
  case 0x1009:
    lVar20 = (long)piVar17 - (long)puVar12 >> 2;
    if ((lVar20 == 1) || (lVar20 == 6)) {
      pVVar8 = GetSourceVoice((ALsource *)this,(ALCcontext *)Source);
      if (*(uint *)(this + 0x178) == 0x1012 && pVVar8 == (Voice *)0x0) {
        *(undefined4 *)(this + 0x178) = 0x1014;
      }
      else if ((*(uint *)(this + 0x178) & 0xfffffffe) == 0x1012) {
        bVar5 = false;
        ALCcontext::setError
                  ((ALCcontext *)Source,0xa004,"Setting buffer on playing or paused source %u",
                   (ulong)*(uint *)(this + 400));
        goto LAB_00121f77;
      }
      _Var19._M_head_impl = *(BufferlistItem **)(this + 0x180);
      if (*puVar12 != 0) {
        __mutex = &device->BufferLock;
        std::mutex::lock(__mutex);
        id = *puVar12;
        size = (size_t)id;
        pAVar9 = LookupBuffer(device,id);
        if (pAVar9 == (ALbuffer *)0x0) {
          pcVar21 = "Invalid buffer ID %u";
          AVar16 = 0xa003;
        }
        else {
          if (pAVar9->MappedAccess == 0 || (pAVar9->MappedAccess & 4) != 0) {
            if (((pAVar9->mBuffer).mCallback == (CallbackType)0x0) ||
               ((pAVar9->ref).super___atomic_base<unsigned_int>._M_i == 0)) {
              puVar11 = (undefined8 *)BufferlistItem::operator_new((BufferlistItem *)0x18,size);
              *puVar11 = 0;
              *(uint *)(puVar11 + 1) = (pAVar9->mBuffer).mSampleLen;
              puVar11[2] = pAVar9;
              LOCK();
              (pAVar9->ref).super___atomic_base<unsigned_int>._M_i =
                   (pAVar9->ref).super___atomic_base<unsigned_int>._M_i + 1;
              UNLOCK();
              *(undefined4 *)(this + 0x174) = 0x1028;
              *(undefined8 **)(this + 0x180) = puVar11;
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              goto LAB_001220d2;
            }
            pcVar21 = "Setting already-set callback buffer %u";
          }
          else {
            pcVar21 = "Setting non-persistently mapped buffer %u";
          }
          id = pAVar9->id;
          AVar16 = 0xa004;
        }
        ALCcontext::setError((ALCcontext *)Source,AVar16,pcVar21,(ulong)id);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
LAB_00122061:
        bVar5 = false;
        goto LAB_00121f77;
      }
      *(undefined4 *)(this + 0x174) = 0x1030;
      *(undefined8 *)(this + 0x180) = 0;
LAB_001220d2:
      while ((tuple<BufferlistItem_*,_std::default_delete<BufferlistItem>_>)_Var19._M_head_impl !=
             (_Head_base<0UL,_BufferlistItem_*,_false>)0x0) {
        pBVar3 = *(BufferlistItem **)&(_Var19._M_head_impl)->mNext;
        if ((_Var19._M_head_impl)->mBuffer != (BufferStorage *)0x0) {
          LOCK();
          piVar1 = (int *)((long)(_Var19._M_head_impl)->mBuffer + 0x70);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        temp._M_t.super___uniq_ptr_impl<BufferlistItem,_std::default_delete<BufferlistItem>_>._M_t.
        super__Tuple_impl<0UL,_BufferlistItem_*,_std::default_delete<BufferlistItem>_>.
        super__Head_base<0UL,_BufferlistItem_*,_false>._M_head_impl =
             (__uniq_ptr_data<BufferlistItem,_std::default_delete<BufferlistItem>,_true,_true>)
             (__uniq_ptr_data<BufferlistItem,_std::default_delete<BufferlistItem>,_true,_true>)
             _Var19._M_head_impl;
        std::unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_>::~unique_ptr(&temp);
        _Var19._M_head_impl = pBVar3;
      }
LAB_001219b4:
      bVar5 = true;
      goto LAB_00121f77;
    }
    Context_00 = (ALCcontext *)0x1009;
    break;
  case 0x100f:
    if ((long)piVar17 - (long)puVar12 == 0x18) {
      pfVar18 = local_50;
      fStack_60 = (float)(int)puVar12[2];
      fStack_5c = (float)(int)puVar12[3];
      local_68 = CONCAT44((float)(int)puVar12[1],(float)(int)*puVar12);
      local_58 = CONCAT44((float)(int)((ulong)*(undefined8 *)(puVar12 + 4) >> 0x20),
                          (float)(int)*(undefined8 *)(puVar12 + 4));
      Context_00 = (ALCcontext *)0x100f;
      goto LAB_001218aa;
    }
    lVar20 = (long)piVar17 - (long)puVar12 >> 2;
    uVar7 = 6;
    Context_00 = (ALCcontext *)0x100f;
    break;
  case 0x1010:
  case 0x1015:
  case 0x1016:
  case 0x1027:
    pcVar21 = "Setting read-only source property 0x%04x";
    AVar16 = 0xa004;
LAB_00121f63:
    bVar5 = false;
    ALCcontext::setError((ALCcontext *)Source,AVar16,pcVar21,Context_00);
    goto LAB_00121f77;
  case 0x1024:
  case 0x1025:
  case 0x1026:
    lVar20 = (long)piVar17 - (long)puVar12 >> 2;
    if ((lVar20 == 1) || (lVar20 == 6)) {
      if (-1 < (int)*puVar12) {
        pVVar8 = GetSourceVoice((ALsource *)this,(ALCcontext *)Source);
        if (pVVar8 != (Voice *)0x0) {
          if ((pVVar8->mFlags & 2) != 0) {
            bVar5 = false;
            ALCcontext::setError
                      ((ALCcontext *)Source,0xa003,"Source offset for callback is invalid");
            goto LAB_00121f77;
          }
          GetSampleOffset(&local_48,*(BufferlistItem **)(this + 0x180),OffsetType,
                          (double)(int)*puVar12);
          if (local_48.mHasValue == false) {
            ALCcontext::setError((ALCcontext *)Source,0xa003,"Invalid source offset");
            goto LAB_00122061;
          }
          local_78.pos = local_48.field_1.mValue.pos;
          local_78.frac = local_48.field_1.mValue.frac;
          local_78.bufferitem = local_48.field_1.mValue.bufferitem;
          temp._M_t.super___uniq_ptr_impl<BufferlistItem,_std::default_delete<BufferlistItem>_>._M_t
          .super__Tuple_impl<0UL,_BufferlistItem_*,_std::default_delete<BufferlistItem>_>.
          super__Head_base<0UL,_BufferlistItem_*,_false>._M_head_impl._0_1_ = 1;
          bVar6 = SetVoiceOffset(pVVar8,&local_78,(ALsource *)this,(ALCcontext *)Source,device);
          bVar5 = true;
          if (bVar6) goto LAB_00121f77;
        }
        *(int *)(this + 0x170) = OffsetType;
        *(double *)(this + 0x168) = (double)(int)*puVar12;
        goto LAB_001219b4;
      }
      goto LAB_00121fed;
    }
    break;
  case 0x1033:
    lVar20 = (long)piVar17 - (long)puVar12 >> 2;
    if ((lVar20 == 1) || (lVar20 == 6)) {
      uVar2 = *puVar12;
      if (uVar2 < 3) {
        this[0x70] = SUB41(uVar2,0);
        bVar5 = true;
        UpdateSourceProps((ALsource *)this,(ALCcontext *)Source);
        goto LAB_00121f77;
      }
      if (1 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Unsupported direct mode: 0x%04x\n",(ulong)uVar2);
        uVar2 = *puVar12;
      }
      ALCcontext::setError
                ((ALCcontext *)Source,0xa003,"Unsupported AL_DIRECT_CHANNELS_SOFT: 0x%04x\n",
                 (ulong)uVar2);
LAB_00121d92:
      if ((lVar20 == 1) || (lVar20 == 6)) {
        uVar7 = *puVar12;
        if ((uVar7 - 0xd001 < 6) || (uVar7 == 0)) {
          *(uint *)(this + 0x68) = uVar7;
          bVar5 = true;
          if (*(char *)&(Source->Direct).GainLF == '\0') goto LAB_00121f77;
          goto LAB_00121dc8;
        }
        goto LAB_00121fed;
      }
    }
    else {
      Context_00 = (ALCcontext *)0x1033;
    }
    break;
  default:
    switch(OffsetType) {
    case 0x20005:
      lVar20 = (long)piVar17 - (long)puVar12 >> 2;
      if ((lVar20 == 1) || (lVar20 == 6)) {
        if (*puVar12 == 0) {
          *(undefined8 *)(this + 0x94) = 0x3f8000003f800000;
          *(undefined8 *)(this + 0x9c) = 0x3f800000459c4000;
          *(undefined4 *)(this + 0xa4) = 0x437a0000;
        }
        else {
          std::mutex::lock(&device->FilterLock);
          uVar7 = *puVar12;
          pAVar10 = LookupFilter(device,uVar7);
          if (pAVar10 == (ALfilter *)0x0) {
            ALCcontext::setError((ALCcontext *)Source,0xa003,"Invalid filter ID %u",(ulong)uVar7);
          }
          else {
            uVar4 = *(undefined8 *)&pAVar10->HFReference;
            *(undefined8 *)(this + 0x94) = *(undefined8 *)&pAVar10->Gain;
            *(undefined8 *)(this + 0x9c) = uVar4;
            *(float *)(this + 0xa4) = pAVar10->LFReference;
          }
          pthread_mutex_unlock((pthread_mutex_t *)&device->FilterLock);
          if (pAVar10 == (ALfilter *)0x0) goto LAB_00122061;
        }
        bVar5 = true;
        UpdateSourceProps((ALsource *)this,(ALCcontext *)Source);
        goto LAB_00121f77;
      }
      Context_00 = (ALCcontext *)0x20005;
      break;
    case 0x20006:
      lVar20 = (long)piVar17 - (long)puVar12 >> 2;
      if ((lVar20 != 3) && (lVar20 != 6)) {
        Context_00 = (ALCcontext *)0x20006;
        goto LAB_00122278;
      }
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)&temp,(mutex_type *)&Source->DirectChannels);
      std::unique_lock<std::mutex>::operator=(&slotlock,(unique_lock<std::mutex> *)&temp);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&temp);
      uVar7 = *puVar12;
      Context_00 = (ALCcontext *)(ulong)uVar7;
      if (uVar7 == 0) {
        lVar20 = 0;
      }
      else {
        uVar7 = uVar7 - 1;
        lVar15 = *(long *)((Source->OrientAt)._M_elems + 1);
        pcVar21 = "Invalid effect ID %u";
        AVar16 = 0xa003;
        if (((ulong)(*(long *)(Source->OrientUp)._M_elems - lVar15 >> 4) <= (ulong)(uVar7 >> 6)) ||
           (uVar13 = (ulong)((uVar7 >> 6) << 4), lVar20 = *(long *)(lVar15 + 8 + uVar13),
           lVar20 == 0 || (*(ulong *)(lVar15 + uVar13) >> ((ulong)uVar7 & 0x3f) & 1) != 0))
        goto LAB_00121f63;
        lVar20 = lVar20 + (ulong)(uVar7 & 0x3f) * 0x1e8;
      }
      Context_00 = (ALCcontext *)(ulong)puVar12[1];
      if (puVar12[1] < device->NumAuxSends) {
        if (puVar12[2] == 0) {
          *(undefined8 *)(this + (long)Context_00 * 0x20 + 0xb0) = 0x3f8000003f800000;
          *(undefined8 *)(this + (long)Context_00 * 0x20 + 0xb0 + 8) = 0x3f800000459c4000;
          *(undefined4 *)(this + (long)Context_00 * 0x20 + 0xc0) = 0x437a0000;
        }
        else {
          std::mutex::lock(&device->FilterLock);
          uVar7 = puVar12[2];
          pAVar10 = LookupFilter(device,uVar7);
          if (pAVar10 == (ALfilter *)0x0) {
            ALCcontext::setError((ALCcontext *)Source,0xa003,"Invalid filter ID %u",(ulong)uVar7);
          }
          else {
            uVar7 = puVar12[1];
            uVar4 = *(undefined8 *)&pAVar10->HFReference;
            *(undefined8 *)(this + (ulong)uVar7 * 0x20 + 0xb0) = *(undefined8 *)&pAVar10->Gain;
            *(undefined8 *)(this + (ulong)uVar7 * 0x20 + 0xb0 + 8) = uVar4;
            *(float *)(this + (ulong)uVar7 * 0x20 + 0xc0) = pAVar10->LFReference;
          }
          pthread_mutex_unlock((pthread_mutex_t *)&device->FilterLock);
          if (pAVar10 == (ALfilter *)0x0) goto LAB_00122061;
          Context_00 = (ALCcontext *)(ulong)puVar12[1];
        }
        lVar15 = *(long *)(this + (long)Context_00 * 0x20 + 0xa8);
        if ((lVar20 != lVar15) && ((*(uint *)(this + 0x178) & 0xfffffffe) == 0x1012)) {
          if (lVar20 != 0) {
            LOCK();
            *(int *)(lVar20 + 0x98) = *(int *)(lVar20 + 0x98) + 1;
            UNLOCK();
            Context_00 = (ALCcontext *)(ulong)puVar12[1];
            lVar15 = *(long *)(this + (long)Context_00 * 0x20 + 0xa8);
          }
          if (lVar15 != 0) {
            LOCK();
            *(int *)(lVar15 + 0x98) = *(int *)(lVar15 + 0x98) + -1;
            UNLOCK();
            Context_00 = (ALCcontext *)(ulong)puVar12[1];
          }
          *(long *)(this + (long)Context_00 * 0x20 + 0xa8) = lVar20;
          pVVar8 = GetSourceVoice((ALsource *)this,(ALCcontext *)Source);
          if (pVVar8 != (Voice *)0x0) {
            bVar5 = true;
            UpdateSourceProps((ALsource *)this,pVVar8,(ALCcontext *)Source);
            goto LAB_00121f77;
          }
          this[0x188] = (anon_unknown_dwarf_50b73)0x0;
          goto LAB_001219b4;
        }
        if (lVar20 != 0) {
          LOCK();
          *(int *)(lVar20 + 0x98) = *(int *)(lVar20 + 0x98) + 1;
          UNLOCK();
          Context_00 = (ALCcontext *)(ulong)puVar12[1];
          lVar15 = *(long *)(this + (long)Context_00 * 0x20 + 0xa8);
        }
        if (lVar15 != 0) {
          LOCK();
          *(int *)(lVar15 + 0x98) = *(int *)(lVar15 + 0x98) + -1;
          UNLOCK();
          Context_00 = (ALCcontext *)(ulong)puVar12[1];
        }
        *(long *)(this + (long)Context_00 * 0x20 + 0xa8) = lVar20;
LAB_00121dc8:
        bVar5 = true;
        UpdateSourceProps((ALsource *)this,(ALCcontext *)Source);
        goto LAB_00121f77;
      }
      pcVar21 = "Invalid send %u";
      AVar16 = 0xa003;
      goto LAB_00121f63;
    case 0x20007:
    case 0x20008:
    case 0x20009:
      goto switchD_00121790_caseD_1001;
    case 0x2000a:
      lVar20 = (long)piVar17 - (long)puVar12 >> 2;
      if ((lVar20 == 1) || (lVar20 == 6)) {
        if (*puVar12 < 2) {
          this[0x72] = SUB41(*puVar12,0);
          goto LAB_00121dc8;
        }
        goto LAB_00121fed;
      }
      Context_00 = (ALCcontext *)0x2000a;
      break;
    case 0x2000b:
      lVar20 = (long)piVar17 - (long)puVar12 >> 2;
      if ((lVar20 == 1) || (lVar20 == 6)) {
        if (*puVar12 < 2) {
          this[0x73] = SUB41(*puVar12,0);
          goto LAB_00121dc8;
        }
        goto LAB_00121fed;
      }
      Context_00 = (ALCcontext *)0x2000b;
      break;
    case 0x2000c:
      lVar20 = (long)piVar17 - (long)puVar12 >> 2;
      if ((lVar20 == 1) || (lVar20 == 6)) {
        if (*puVar12 < 2) {
          this[0x74] = SUB41(*puVar12,0);
          goto LAB_00121dc8;
        }
        goto LAB_00121fed;
      }
      Context_00 = (ALCcontext *)0x2000c;
      break;
    default:
      if (OffsetType == 0x202) {
        lVar20 = (long)piVar17 - (long)puVar12 >> 2;
        if ((lVar20 == 1) || (lVar20 == 6)) {
          if (*puVar12 < 2) {
            this[100] = SUB41(*puVar12,0);
            goto LAB_00121dc8;
          }
          goto LAB_00121fed;
        }
        Context_00 = (ALCcontext *)0x202;
      }
      else if (OffsetType == 0x1212) {
        lVar20 = (long)piVar17 - (long)puVar12 >> 2;
        if ((lVar20 == 1) || (lVar20 == 6)) {
          if (*puVar12 < 7) {
            *(uint *)(this + 0x6c) = *puVar12;
            goto LAB_00121dc8;
          }
          goto LAB_00121fed;
        }
        Context_00 = (ALCcontext *)0x1212;
      }
      else {
        if (OffsetType != 0x1214) {
          if (OffsetType != 0xc000) {
            if (OffsetType == 0xd000) {
              lVar20 = (long)piVar17 - (long)puVar12 >> 2;
              goto LAB_00121d92;
            }
            goto switchD_00121790_caseD_1008;
          }
          goto switchD_00121790_caseD_1001;
        }
        lVar20 = (long)piVar17 - (long)puVar12 >> 2;
        if ((lVar20 == 1) || (lVar20 == 6)) {
          uVar7 = *puVar12;
          Context_00 = (ALCcontext *)(ulong)uVar7;
          if (uVar7 < 3) {
            this[0x71] = SUB41(uVar7,0);
            bVar5 = true;
            UpdateSourceProps((ALsource *)this,(ALCcontext *)Source);
            goto LAB_00121f77;
          }
          pcVar21 = "Unsupported AL_SOURCE_SPATIALIZE_SOFT: 0x%04x\n";
          AVar16 = 0xa003;
          if (1 < (int)gLogLevel) {
            fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Unsupported spatialize mode: 0x%04x\n",
                    (ulong)uVar7);
            Context_00 = (ALCcontext *)(ulong)*puVar12;
          }
          goto LAB_00121f63;
        }
        Context_00 = (ALCcontext *)0x1214;
      }
    }
  }
  bVar5 = false;
  ALCcontext::setError
            ((ALCcontext *)Source,0xa002,"Property 0x%04x expects %d value(s), got %zu",Context_00,
             (ulong)uVar7,lVar20);
LAB_00121f77:
  std::unique_lock<std::mutex>::~unique_lock(&slotlock);
  return bVar5;
}

Assistant:

bool SetSourceiv(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<const int> values)
{
    ALCdevice *device{Context->mDevice.get()};
    ALeffectslot *slot{nullptr};
    BufferlistItem *oldlist{nullptr};
    std::unique_lock<std::mutex> slotlock;
    float fvals[6];

    switch(prop)
    {
    case AL_SOURCE_STATE:
    case AL_SOURCE_TYPE:
    case AL_BUFFERS_QUEUED:
    case AL_BUFFERS_PROCESSED:
        /* Query only */
        SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
            "Setting read-only source property 0x%04x", prop);

    case AL_SOURCE_RELATIVE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->HeadRelative = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_LOOPING:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->Looping = values[0] != AL_FALSE;
        if(IsPlayingOrPaused(Source))
        {
            if(Voice *voice{GetSourceVoice(Source, Context)})
            {
                if(Source->Looping)
                    voice->mLoopBuffer.store(Source->queue, std::memory_order_release);
                else
                    voice->mLoopBuffer.store(nullptr, std::memory_order_release);

                /* If the source is playing, wait for the current mix to finish
                 * to ensure it isn't currently looping back or reaching the
                 * end.
                 */
                device->waitForMix();
            }
        }
        return true;

    case AL_BUFFER:
        CHECKSIZE(values, 1);
        {
            const ALenum state{GetSourceState(Source, GetSourceVoice(Source, Context))};
            if(state == AL_PLAYING || state == AL_PAUSED)
                SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
                    "Setting buffer on playing or paused source %u", Source->id);
        }
        oldlist = Source->queue;
        if(values[0])
        {
            std::lock_guard<std::mutex> _{device->BufferLock};
            ALbuffer *buffer{LookupBuffer(device, static_cast<ALuint>(values[0]))};
            if(!buffer)
                SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid buffer ID %u",
                    static_cast<ALuint>(values[0]));
            if(buffer->MappedAccess && !(buffer->MappedAccess&AL_MAP_PERSISTENT_BIT_SOFT))
                SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
                    "Setting non-persistently mapped buffer %u", buffer->id);
            if(buffer->mBuffer.mCallback && ReadRef(buffer->ref) != 0)
                SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
                    "Setting already-set callback buffer %u", buffer->id);

            /* Add the selected buffer to a one-item queue */
            auto newlist = new BufferlistItem{};
            newlist->mSampleLen = buffer->mBuffer.mSampleLen;
            newlist->mBuffer = &buffer->mBuffer;
            IncrementRef(buffer->ref);

            /* Source is now Static */
            Source->SourceType = AL_STATIC;
            Source->queue = newlist;
        }
        else
        {
            /* Source is now Undetermined */
            Source->SourceType = AL_UNDETERMINED;
            Source->queue = nullptr;
        }

        /* Delete all elements in the previous queue */
        while(oldlist != nullptr)
        {
            std::unique_ptr<BufferlistItem> temp{oldlist};
            oldlist = temp->mNext.load(std::memory_order_relaxed);

            if(BufferStorage *buffer{temp->mBuffer})
                DecrementRef(BufferFromStorage(buffer)->ref);
        }
        return true;

    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0);

        if(Voice *voice{GetSourceVoice(Source, Context)})
        {
            if((voice->mFlags&VoiceIsCallback))
                SETERR_RETURN(Context, AL_INVALID_VALUE, false,
                    "Source offset for callback is invalid");
            auto vpos = GetSampleOffset(Source->queue, prop, values[0]);
            if(!vpos) SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid source offset");

            if(SetVoiceOffset(voice, *vpos, Source, Context, device))
                return true;
        }
        Source->OffsetType = prop;
        Source->Offset = values[0];
        return true;

    case AL_DIRECT_FILTER:
        CHECKSIZE(values, 1);
        if(values[0])
        {
            std::lock_guard<std::mutex> _{device->FilterLock};
            ALfilter *filter{LookupFilter(device, static_cast<ALuint>(values[0]))};
            if(!filter)
                SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid filter ID %u",
                    static_cast<ALuint>(values[0]));
            Source->Direct.Gain = filter->Gain;
            Source->Direct.GainHF = filter->GainHF;
            Source->Direct.HFReference = filter->HFReference;
            Source->Direct.GainLF = filter->GainLF;
            Source->Direct.LFReference = filter->LFReference;
        }
        else
        {
            Source->Direct.Gain = 1.0f;
            Source->Direct.GainHF = 1.0f;
            Source->Direct.HFReference = LOWPASSFREQREF;
            Source->Direct.GainLF = 1.0f;
            Source->Direct.LFReference = HIGHPASSFREQREF;
        }
        return UpdateSourceProps(Source, Context);

    case AL_DIRECT_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->DryGainHFAuto = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->WetGainAuto = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->WetGainHFAuto = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_DIRECT_CHANNELS_SOFT:
        CHECKSIZE(values, 1);
        if(auto mode = DirectModeFromEnum(values[0]))
        {
            Source->DirectChannels = *mode;
            return UpdateSourceProps(Source, Context);
        }
        Context->setError(AL_INVALID_VALUE, "Unsupported AL_DIRECT_CHANNELS_SOFT: 0x%04x\n",
            values[0]);

    case AL_DISTANCE_MODEL:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_NONE ||
            values[0] == AL_INVERSE_DISTANCE || values[0] == AL_INVERSE_DISTANCE_CLAMPED ||
            values[0] == AL_LINEAR_DISTANCE || values[0] == AL_LINEAR_DISTANCE_CLAMPED ||
            values[0] == AL_EXPONENT_DISTANCE || values[0] == AL_EXPONENT_DISTANCE_CLAMPED);

        Source->mDistanceModel = static_cast<DistanceModel>(values[0]);
        if(Context->mSourceDistanceModel)
            return UpdateSourceProps(Source, Context);
        return true;

    case AL_SOURCE_RESAMPLER_SOFT:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0 && values[0] <= static_cast<int>(Resampler::Max));

        Source->mResampler = static_cast<Resampler>(values[0]);
        return UpdateSourceProps(Source, Context);

    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        if(auto mode = SpatializeModeFromEnum(values[0]))
        {
            Source->mSpatialize = *mode;
            return UpdateSourceProps(Source, Context);
        }
        Context->setError(AL_INVALID_VALUE, "Unsupported AL_SOURCE_SPATIALIZE_SOFT: 0x%04x\n",
            values[0]);
        return false;

    case AL_AUXILIARY_SEND_FILTER:
        CHECKSIZE(values, 3);
        slotlock = std::unique_lock<std::mutex>{Context->mEffectSlotLock};
        if(values[0] && (slot=LookupEffectSlot(Context, static_cast<ALuint>(values[0]))) == nullptr)
            SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid effect ID %u", values[0]);
        if(static_cast<ALuint>(values[1]) >= device->NumAuxSends)
            SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid send %u", values[1]);

        if(values[2])
        {
            std::lock_guard<std::mutex> _{device->FilterLock};
            ALfilter *filter{LookupFilter(device, static_cast<ALuint>(values[2]))};
            if(!filter)
                SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid filter ID %u", values[2]);

            auto &send = Source->Send[static_cast<ALuint>(values[1])];
            send.Gain = filter->Gain;
            send.GainHF = filter->GainHF;
            send.HFReference = filter->HFReference;
            send.GainLF = filter->GainLF;
            send.LFReference = filter->LFReference;
        }
        else
        {
            /* Disable filter */
            auto &send = Source->Send[static_cast<ALuint>(values[1])];
            send.Gain = 1.0f;
            send.GainHF = 1.0f;
            send.HFReference = LOWPASSFREQREF;
            send.GainLF = 1.0f;
            send.LFReference = HIGHPASSFREQREF;
        }

        if(slot != Source->Send[static_cast<ALuint>(values[1])].Slot && IsPlayingOrPaused(Source))
        {
            /* Add refcount on the new slot, and release the previous slot */
            if(slot) IncrementRef(slot->ref);
            if(auto *oldslot = Source->Send[static_cast<ALuint>(values[1])].Slot)
                DecrementRef(oldslot->ref);
            Source->Send[static_cast<ALuint>(values[1])].Slot = slot;

            /* We must force an update if the auxiliary slot changed on an
             * active source, in case the slot is about to be deleted.
             */
            Voice *voice{GetSourceVoice(Source, Context)};
            if(voice) UpdateSourceProps(Source, voice, Context);
            else Source->PropsClean.clear(std::memory_order_release);
        }
        else
        {
            if(slot) IncrementRef(slot->ref);
            if(auto *oldslot = Source->Send[static_cast<ALuint>(values[1])].Slot)
                DecrementRef(oldslot->ref);
            Source->Send[static_cast<ALuint>(values[1])].Slot = slot;
            UpdateSourceProps(Source, Context);
        }
        return true;


    /* 1x float */
    case AL_CONE_INNER_ANGLE:
    case AL_CONE_OUTER_ANGLE:
    case AL_PITCH:
    case AL_GAIN:
    case AL_MIN_GAIN:
    case AL_MAX_GAIN:
    case AL_REFERENCE_DISTANCE:
    case AL_ROLLOFF_FACTOR:
    case AL_CONE_OUTER_GAIN:
    case AL_MAX_DISTANCE:
    case AL_DOPPLER_FACTOR:
    case AL_CONE_OUTER_GAINHF:
    case AL_AIR_ABSORPTION_FACTOR:
    case AL_ROOM_ROLLOFF_FACTOR:
    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        fvals[0] = static_cast<float>(values[0]);
        return SetSourcefv(Source, Context, prop, {fvals, 1u});

    /* 3x float */
    case AL_POSITION:
    case AL_VELOCITY:
    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        fvals[0] = static_cast<float>(values[0]);
        fvals[1] = static_cast<float>(values[1]);
        fvals[2] = static_cast<float>(values[2]);
        return SetSourcefv(Source, Context, prop, {fvals, 3u});

    /* 6x float */
    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        fvals[0] = static_cast<float>(values[0]);
        fvals[1] = static_cast<float>(values[1]);
        fvals[2] = static_cast<float>(values[2]);
        fvals[3] = static_cast<float>(values[3]);
        fvals[4] = static_cast<float>(values[4]);
        fvals[5] = static_cast<float>(values[5]);
        return SetSourcefv(Source, Context, prop, {fvals, 6u});

    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_CLOCK_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
    case AL_STEREO_ANGLES:
        break;
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source integer property 0x%04x", prop);
    return false;
}